

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRConstantOp * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::
allocate<unsigned_int&,spv::Op&,unsigned_int_const*,unsigned_int>
          (ObjectPool<spirv_cross::SPIRConstantOp> *this,uint *p,Op *p_1,uint **p_2,uint *p_3)

{
  size_t sVar1;
  _Tuple_impl<0UL,_spirv_cross::SPIRConstantOp_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
  _Var2;
  uint uVar3;
  _Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false> _Var4;
  SPIRConstantOp *this_00;
  ulong uVar5;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size == 0) {
    uVar3 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>)malloc((ulong)uVar3 * 0x50);
    if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl !=
        (SPIRConstantOp *)0x0) {
      if (uVar3 != 0) {
        uVar5 = (ulong)uVar3;
        _Var4._M_head_impl =
             (SPIRConstantOp *)
             _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl;
        do {
          SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size + 1
                    );
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.ptr[sVar1] =
               _Var4._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size = sVar1 + 1;
          _Var4._M_head_impl = _Var4._M_head_impl + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRConstantOp_*,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false> =
           _Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRConstantOp,_spirv_cross::ObjectPool<spirv_cross::SPIRConstantOp>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var2.super__Head_base<0UL,_spirv_cross::SPIRConstantOp_*,_false>._M_head_impl !=
          (SPIRConstantOp *)0x0) goto LAB_0033052b;
    }
    this_00 = (SPIRConstantOp *)0x0;
  }
  else {
LAB_0033052b:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.buffer_size;
    this_00 = (this->vacants).super_VectorView<spirv_cross::SPIRConstantOp_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRConstantOp_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    SPIRConstantOp::SPIRConstantOp(this_00,(TypeID)*p,*p_1,*p_2,*p_3);
  }
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}